

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderRenderTextureFunctionTests.cpp
# Opt level: O1

void vkt::sr::anon_unknown_0::evalTexture2DProjGrad3Offset(ShaderEvalContext *c,TexLookupParams *p)

{
  float fVar1;
  float fVar2;
  float fVar3;
  Texture2D *pTVar4;
  int i;
  long lVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  Vector<float,_4> res_1;
  Vector<float,_4> res;
  undefined8 local_48;
  undefined8 uStack_40;
  float local_38 [6];
  
  pTVar4 = c->textures[0].tex2D;
  fVar8 = (float)pTVar4->m_width;
  fVar1 = c->in[0].m_data[2];
  fVar9 = (float)pTVar4->m_height;
  fVar2 = c->in[0].m_data[0];
  fVar3 = c->in[0].m_data[1];
  fVar6 = c->in[1].m_data[0] * fVar8;
  fVar7 = c->in[1].m_data[1] * fVar9;
  fVar8 = fVar8 * c->in[2].m_data[0];
  fVar9 = fVar9 * c->in[2].m_data[1];
  fVar6 = fVar6 * fVar6 + fVar7 * fVar7;
  if (fVar6 < 0.0) {
    fVar6 = sqrtf(fVar6);
  }
  else {
    fVar6 = SQRT(fVar6);
  }
  fVar7 = fVar8 * fVar8 + fVar9 * fVar9;
  if (fVar7 < 0.0) {
    fVar7 = sqrtf(fVar7);
  }
  else {
    fVar7 = SQRT(fVar7);
  }
  fVar6 = logf((float)(~-(uint)(fVar7 <= fVar6) & (uint)fVar7 |
                      (uint)fVar6 & -(uint)(fVar7 <= fVar6)));
  local_48 = *(undefined8 *)(p->offset).m_data;
  pTVar4 = c->textures[0].tex2D;
  uStack_40 = (ulong)uStack_40._4_4_ << 0x20;
  tcu::sampleLevelArray2DOffset
            ((ConstPixelBufferAccess *)&stack0xffffffffffffffe0,(int)(pTVar4->m_view).m_levels,
             (Sampler *)(ulong)(uint)(pTVar4->m_view).m_numLevels,fVar2 / fVar1,fVar3 / fVar1,
             fVar6 * 1.442695,(IVec3 *)c->textures);
  local_38[0] = 0.0;
  local_38[1] = 0.0;
  local_38[2] = 0.0;
  local_38[3] = 0.0;
  lVar5 = 0;
  do {
    local_38[lVar5] = *(float *)(&stack0xffffffffffffffe0 + lVar5 * 4) * (p->scale).m_data[lVar5];
    lVar5 = lVar5 + 1;
  } while (lVar5 != 4);
  local_48 = 0;
  uStack_40 = 0;
  lVar5 = 0;
  do {
    *(float *)((long)&local_48 + lVar5 * 4) = local_38[lVar5] + (p->bias).m_data[lVar5];
    lVar5 = lVar5 + 1;
  } while (lVar5 != 4);
  *(undefined8 *)(c->color).m_data = local_48;
  *(long *)((c->color).m_data + 2) = uStack_40;
  return;
}

Assistant:

static void		evalTexture2DProjGrad3Offset	(ShaderEvalContext& c, const TexLookupParams& p)	{ c.color = texture2DOffset(c, c.in[0].x()/c.in[0].z(), c.in[0].y()/c.in[0].z(), computeLodFromGrad2D(c), p.offset.swizzle(0,1))*p.scale + p.bias; }